

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_convert_int.c
# Opt level: O2

int mpt_data_convert_uint8(uint8_t *from,mpt_type_t type,void *dest)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  iovec *vec;
  byte bVar4;
  
  if (from == (uint8_t *)0x0) {
    bVar4 = 0;
  }
  else {
    bVar4 = *from;
  }
  if (type == 0x6c) {
    cVar1 = mpt_type_int(8);
    type = (mpt_type_t)cVar1;
  }
  iVar2 = -3;
  switch(type) {
  case 0x62:
    if ((char)bVar4 < '\0') {
      return -2;
    }
  case 0x79:
switchD_0010ebe9_caseD_79:
    iVar2 = 1;
    if (dest != (void *)0x0) {
      *(byte *)dest = bVar4;
    }
    break;
  case 99:
    ppuVar3 = __ctype_b_loc();
    if (-1 < (short)(*ppuVar3)[bVar4]) {
      return -2;
    }
    goto switchD_0010ebe9_caseD_79;
  case 100:
    iVar2 = 8;
    if (dest != (void *)0x0) {
      *(double *)dest = (double)bVar4;
    }
    break;
  case 0x65:
    iVar2 = 8;
    if (dest != (void *)0x0) {
      *(longdouble *)dest = (longdouble)bVar4;
    }
    break;
  case 0x66:
    iVar2 = 4;
    if (dest != (void *)0x0) {
      *(float *)dest = (float)bVar4;
    }
    break;
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x73:
  case 0x76:
  case 0x77:
    break;
  case 0x69:
  case 0x75:
    *(uint *)dest = (uint)bVar4;
    iVar2 = 4;
    break;
  case 0x6e:
  case 0x71:
    iVar2 = 2;
    if (dest != (void *)0x0) {
      *(ushort *)dest = (ushort)bVar4;
    }
    break;
  case 0x74:
  case 0x78:
    *(ulong *)dest = (ulong)bVar4;
    iVar2 = 8;
    break;
  default:
    if (type == 0x59) {
      if (dest == (void *)0x0) {
        iVar2 = -0x10;
      }
      else {
        *(uint8_t **)dest = from;
        *(undefined8 *)((long)dest + 8) = 1;
        iVar2 = 0x10;
      }
    }
  }
  return iVar2;
}

Assistant:

extern int mpt_data_convert_uint8(const uint8_t *from, MPT_TYPE(type) type, void *dest)
{
	uint8_t val = 0;
	if (from) {
		val = *from;
	}
	if (type == 'l') {
		type = mpt_type_int(sizeof(long));
	}
	switch (type) {
		case 'c':
			if (!isgraph(val)) return MPT_ERROR(BadValue);
			if (dest) *((char *) dest) = val;
			return sizeof(char);
		case 'b':
			if (val > INT8_MAX) return MPT_ERROR(BadValue);
			/* fall through */
		case 'y':
			if (dest) *((uint8_t *) dest) = val;
			return sizeof(uint8_t);
		case 'n':
		case 'q':
			if (dest) *((uint16_t *) dest) = val;
			return sizeof(uint16_t);
		case 'i':
		case 'u':
			*((uint32_t *) dest) = val;
			return sizeof(uint32_t);
		case 'x':
		case 't':
			*((uint64_t *) dest) = val;
			return sizeof(uint64_t);
		
		case 'f':
			if (dest) *((float *) dest) = val;
			return sizeof(float);
		case 'd':
			if (dest) *((double *) dest) = val;
			return sizeof(double);
	#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e':
			if (dest) *((long double *) dest) = val;
			return sizeof(double);
	#endif
		case MPT_type_toVector('y'):
			if (dest) {
				struct iovec *vec = dest;
				vec->iov_base = (void *) from;
				vec->iov_len  = sizeof(*from);
				return sizeof(*vec);
			}
			return MPT_ERROR(MissingData);
		default:
			/* invalid conversion */
			return MPT_ERROR(BadType);
	}
}